

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O3

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,Formals *formals)

{
  FrameTranslator *this_00;
  pointer ppVar1;
  pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *formal;
  pointer ppVar2;
  string local_48;
  
  this_00 = this->current_frame_;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"this","");
  IRT::FrameTranslator::AddArgumentAddress(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  ppVar1 = (formals->formals_).
           super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (formals->formals_).
                super__Vector_base<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    IRT::FrameTranslator::AddArgumentAddress(this->current_frame_,&ppVar2->second);
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(Formals* formals) {
  current_frame_->AddArgumentAddress("this");
  for (const auto& formal : formals->formals_) {
    current_frame_->AddArgumentAddress(formal.second);
  }
}